

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O3

void taking_mouse_down(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  DLword *pDVar18;
  uint uVar19;
  uint uVar20;
  uint *local_60;
  int local_54;
  byte bVar7;
  
  uVar4 = displaywidth;
  iVar3 = LastCursorClippingX;
  if (DisplayInitialized != 0) {
    uVar5 = displaywidth + 0xf;
    if (-1 < (int)displaywidth) {
      uVar5 = displaywidth;
    }
    if (LastCursorX < 0) {
      uVar9 = -(ulong)(7U - LastCursorX >> 3);
    }
    else {
      uVar9 = (ulong)((uint)LastCursorX >> 3);
    }
    uVar9 = (long)DisplayRegion68k + uVar9 + (long)((int)uVar5 >> 4) * (long)LastCursorY * 2;
    if (0 < LastCursorClippingY) {
      uVar5 = (LastCursorX & 7U) + ((uint)uVar9 & 3) * 8;
      uVar8 = -uVar5 & 0x1f;
      uVar11 = 0;
      uVar15 = -(uint)(uVar8 == 0) | ~(-1 << (sbyte)uVar8);
      uVar10 = (uVar5 + LastCursorClippingX) - 1 & 0x1f;
      uVar20 = -1 << (~(byte)uVar10 & 0x1f);
      uVar16 = -(uint)(uVar5 == 0) | -1 << (-(char)uVar5 & 0x1fU) ^ 0xffffffffU;
      uVar19 = uVar20 & uVar16;
      local_60 = (uint *)(uVar9 & 0xfffffffffffffffc);
      pDVar18 = MonoCursor_savebitmap;
      local_54 = LastCursorClippingX;
      uVar12 = 0;
      uVar13 = uVar5;
      iVar2 = LastCursorClippingY;
      do {
        sVar6 = (sbyte)uVar8;
        bVar7 = (byte)uVar5;
        if (uVar13 < uVar12) {
          uVar8 = *(uint *)pDVar18 << sVar6;
          if (0x20 < (int)(uVar12 + iVar3)) {
            puVar14 = (uint *)((long)pDVar18 + 8);
            uVar5 = *(uint *)((long)pDVar18 + 4);
            uVar8 = uVar8 | uVar5 >> (bVar7 & 0x1f) & uVar15;
            goto LAB_00128dc4;
          }
          puVar14 = (uint *)((long)pDVar18 + 4);
        }
        else {
          puVar14 = (uint *)((long)pDVar18 + 4);
          uVar5 = *(uint *)pDVar18;
          uVar8 = uVar5 >> (bVar7 & 0x1f) & uVar15;
LAB_00128dc4:
          uVar11 = ~uVar15 & uVar5 << sVar6;
        }
        puVar17 = local_60;
        if ((int)(iVar3 + uVar13) < 0x21) {
LAB_00128deb:
          *puVar17 = (uVar8 ^ *puVar17) & uVar19 ^ *puVar17;
        }
        else {
          uVar5 = (int)(uVar13 + iVar3) >> 5;
          *local_60 = (uVar8 ^ *local_60) & uVar16 ^ *local_60;
          puVar17 = local_60 + 1;
          if (uVar12 == uVar13) {
            if (1 < (int)uVar5) {
              do {
                uVar19 = *puVar14;
                puVar14 = puVar14 + 1;
                *puVar17 = uVar19;
                puVar17 = puVar17 + 1;
                uVar5 = uVar5 - 1;
              } while (1 < uVar5);
            }
          }
          else if (1 < (int)uVar5) {
            do {
              uVar19 = *puVar14;
              puVar14 = puVar14 + 1;
              uVar8 = uVar19 >> (bVar7 & 0x1f) | uVar11;
              uVar11 = uVar19 << sVar6;
              *puVar17 = uVar8;
              puVar17 = puVar17 + 1;
              uVar5 = uVar5 - 1;
            } while (1 < uVar5);
          }
          if (uVar10 != 0x1f) {
            uVar19 = uVar20;
            uVar8 = uVar11;
            if ((local_54 - 1U & 0x1f) <= uVar10) {
              uVar8 = *puVar14 >> (bVar7 & 0x1f) & uVar15 | uVar11;
            }
            goto LAB_00128deb;
          }
        }
        uVar15 = uVar13 + uVar4;
        local_60 = local_60 + ((int)uVar15 >> 5);
        uVar13 = uVar15 & 0x1f;
        uVar10 = (uVar13 + iVar3) - 1 & 0x1f;
        uVar16 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
        uVar20 = -1 << (~(byte)uVar10 & 0x1f);
        uVar19 = uVar20 & uVar16;
        uVar8 = uVar12 + 0x10;
        pDVar18 = (DLword *)((long)pDVar18 + (ulong)(uVar8 >> 5) * 4);
        local_54 = uVar12 + iVar3 + 0x10;
        uVar12 = uVar8 & 0x1f;
        uVar5 = uVar15 - uVar8 & 0x1f;
        uVar8 = uVar8 - uVar15 & 0x1f;
        uVar15 = -(uint)(uVar8 == 0) | ~(-1 << (sbyte)uVar8);
        bVar1 = 1 < iVar2;
        iVar2 = iVar2 + -1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void taking_mouse_down(void) {
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;

#ifdef DOS
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#else
  if (!DisplayInitialized) return;

  /* restore saved image */
  srcbase = MonoCursor_savebitmap;
  dstbase = DisplayRegion68k + ((LastCursorY)*DLWORD_PERLINE); /* old y */
  sx = 0;
  dx = LastCursorX;        /* old x */
  w = LastCursorClippingX; /* Old clipping */
  h = LastCursorClippingY;
  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 0;
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, (LastCursorY), w, h);
#endif /* DISPLAYBUFFER */
#endif /* DOS */
}